

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_latlink_t * ps_lattice_traverse_next(ps_lattice_t *dag,ps_latnode_t *end)

{
  latlink_list_t *local_30;
  latlink_list_t *x;
  ps_latlink_t *next;
  ps_latnode_t *end_local;
  ps_lattice_t *dag_local;
  
  dag_local = (ps_lattice_t *)ps_lattice_popq(dag);
  if (dag_local == (ps_lattice_t *)0x0) {
    dag_local = (ps_lattice_t *)0x0;
  }
  else {
    ((anon_union_8_4_397b8dde_for_info *)&dag_local->lmath->base)->fanin =
         ((anon_union_8_4_397b8dde_for_info *)&dag_local->lmath->base)->fanin + -1;
    if (((anon_union_8_4_397b8dde_for_info *)&dag_local->lmath->base)->fanin == 0) {
      next = (ps_latlink_t *)end;
      if (end == (ps_latnode_t *)0x0) {
        next = (ps_latlink_t *)dag->end;
      }
      if (dag_local->lmath == (logmath_t *)next) {
        ps_lattice_delq(dag);
      }
      else {
        for (local_30 = (latlink_list_t *)dag_local->lmath->log_of_base;
            local_30 != (latlink_list_t *)0x0; local_30 = local_30->next) {
          ps_lattice_pushq(dag,local_30->link);
        }
      }
    }
  }
  return (ps_latlink_t *)dag_local;
}

Assistant:

ps_latlink_t *
ps_lattice_traverse_next(ps_lattice_t *dag, ps_latnode_t *end)
{
    ps_latlink_t *next;

    next = ps_lattice_popq(dag);
    if (next == NULL)
        return NULL;

    /* Decrease fanin count for destination node and expand outgoing
     * edges if all incoming edges have been seen. */
    --next->to->info.fanin;
    if (next->to->info.fanin == 0) {
        latlink_list_t *x;

        if (end == NULL) end = dag->end;
        if (next->to == end) {
            /* If we have traversed all links entering the end node,
             * clear the queue, causing future calls to this function
             * to return NULL. */
            ps_lattice_delq(dag);
            return next;
        }

        /* Extend all outgoing edges. */
        for (x = next->to->exits; x; x = x->next)
            ps_lattice_pushq(dag, x->link);
    }
    return next;
}